

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::WriteFrame(IMkvWriter *writer,Frame *frame,Cluster *cluster)

{
  bool bVar1;
  uint64_t uVar2;
  int64_t timecode;
  Cluster *in_RDX;
  Frame *in_RSI;
  long in_RDI;
  int64 relative_timecode;
  uint64 in_stack_00000050;
  int64 in_stack_00000058;
  Frame *in_stack_00000060;
  IMkvWriter *in_stack_00000068;
  Frame *in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  Cluster *in_stack_ffffffffffffffb8;
  uint64 local_40;
  uint64 local_8;
  
  if ((((in_RDI == 0) || (in_RSI == (Frame *)0x0)) ||
      (bVar1 = Frame::IsValid(in_stack_ffffffffffffffa8), !bVar1)) ||
     ((in_RDX == (Cluster *)0x0 || (uVar2 = Cluster::timecode_scale(in_RDX), uVar2 == 0)))) {
    local_8 = 0;
  }
  else {
    Frame::timestamp(in_RSI);
    Cluster::timecode_scale(in_RDX);
    timecode = Cluster::GetRelativeTimecode(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if ((timecode < 0) || (0x7fff < timecode)) {
      local_8 = 0;
    }
    else {
      bVar1 = Frame::CanBeSimpleBlock(in_RSI);
      if (bVar1) {
        local_40 = anon_unknown_0::WriteSimpleBlock((IMkvWriter *)in_RSI,(Frame *)in_RDX,timecode);
      }
      else {
        Cluster::timecode_scale(in_RDX);
        local_40 = anon_unknown_0::WriteBlock
                             (in_stack_00000068,in_stack_00000060,in_stack_00000058,
                              in_stack_00000050);
      }
      local_8 = local_40;
    }
  }
  return local_8;
}

Assistant:

uint64 WriteFrame(IMkvWriter* writer, const Frame* const frame,
                  Cluster* cluster) {
  if (!writer || !frame || !frame->IsValid() || !cluster ||
      !cluster->timecode_scale())
    return 0;

  //  Technically the timecode for a block can be less than the
  //  timecode for the cluster itself (remember that block timecode
  //  is a signed, 16-bit integer).  However, as a simplification we
  //  only permit non-negative cluster-relative timecodes for blocks.
  const int64 relative_timecode = cluster->GetRelativeTimecode(
      frame->timestamp() / cluster->timecode_scale());
  if (relative_timecode < 0 || relative_timecode > kMaxBlockTimecode)
    return 0;

  return frame->CanBeSimpleBlock()
             ? WriteSimpleBlock(writer, frame, relative_timecode)
             : WriteBlock(writer, frame, relative_timecode,
                          cluster->timecode_scale());
}